

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

char * google::protobuf::internal::VarintParse<unsigned_long>(char *p,unsigned_long *out)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  uint8 *ptr;
  
  cVar1 = *p;
  if (-1 < (long)cVar1) {
    *out = (long)cVar1;
    return p + 1;
  }
  uVar4 = (ulong)((int)cVar1 & 0x7fU | (uint)(byte)p[1] << 7);
  if (-1 < p[1]) {
    *out = uVar4;
    return p + 2;
  }
  pcVar2 = p + 3;
  lVar3 = 0xe;
  do {
    uVar4 = ((ulong)(byte)pcVar2[-1] - 1 << ((byte)lVar3 & 0x3f)) + uVar4;
    if (-1 < pcVar2[-1]) goto LAB_0023fed8;
    pcVar2 = pcVar2 + 1;
    lVar3 = lVar3 + 7;
  } while (lVar3 != 0x46);
  pcVar2 = (char *)0x0;
  uVar4 = 0;
LAB_0023fed8:
  *out = uVar4;
  return pcVar2;
}

Assistant:

PROTOBUF_MUST_USE_RESULT const char* VarintParse(const char* p, T* out) {
  auto ptr = reinterpret_cast<const uint8*>(p);
  uint32 res = ptr[0];
  if (!(res & 0x80)) {
    *out = res;
    return p + 1;
  }
  uint32 byte = ptr[1];
  res += (byte - 1) << 7;
  if (!(byte & 0x80)) {
    *out = res;
    return p + 2;
  }
  return VarintParseSlow(p, res, out);
}